

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O2

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCache(ValenceCache<draco::CornerTable> *this)

{
  _Vector_base<int,_std::allocator<int>_> local_18;
  
  local_18._M_impl.super__Vector_impl_data._M_start =
       (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_18._M_impl.super__Vector_impl_data._M_finish =
       (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (local_18._M_impl.super__Vector_impl_data._M_finish !=
      local_18._M_impl.super__Vector_impl_data._M_start) {
    (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_18._M_impl.super__Vector_impl_data._M_start;
    local_18._M_impl.super__Vector_impl_data._M_finish =
         local_18._M_impl.super__Vector_impl_data._M_start;
  }
  local_18._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_18);
  return;
}

Assistant:

void ClearValenceCache() const {
    vertex_valence_cache_32_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int32_t>().swap(vertex_valence_cache_32_bit_);
  }